

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_lpf1_config *
ma_lpf1_config_init(ma_lpf1_config *__return_storage_ptr__,ma_format format,ma_uint32 channels,
                   ma_uint32 sampleRate,double cutoffFrequency)

{
  __return_storage_ptr__->format = ma_format_unknown;
  __return_storage_ptr__->channels = 0;
  *(undefined8 *)&__return_storage_ptr__->sampleRate = 0;
  __return_storage_ptr__->cutoffFrequency = 0.0;
  __return_storage_ptr__->q = 0.0;
  __return_storage_ptr__->format = format;
  __return_storage_ptr__->channels = channels;
  __return_storage_ptr__->sampleRate = sampleRate;
  __return_storage_ptr__->cutoffFrequency = cutoffFrequency;
  __return_storage_ptr__->q = 0.5;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_lpf1_config ma_lpf1_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double cutoffFrequency)
{
    ma_lpf1_config config;

    MA_ZERO_OBJECT(&config);
    config.format = format;
    config.channels = channels;
    config.sampleRate = sampleRate;
    config.cutoffFrequency = cutoffFrequency;
    config.q = 0.5;

    return config;
}